

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryInit
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,MemoryInit *curr)

{
  Memory *pMVar1;
  
  pMVar1 = Module::getMemory(this->wasm,(Name)(curr->memory).super_IString.str);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->dest,(Type)(pMVar1->addressType).id);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->offset,(Type)0x2);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->size,(Type)0x2);
  return;
}

Assistant:

void visitMemoryInit(MemoryInit* curr) {
    notePointer(&curr->dest, curr->memory);
    note(&curr->offset, Type::i32);
    note(&curr->size, Type::i32);
  }